

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O1

string * __thiscall
testing::internal::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,type_info *type)

{
  char *__ptr;
  char *__s;
  undefined1 *local_70;
  string name_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  int local_30;
  allocator<char> local_29;
  int status;
  
  __s = *(char **)(this + 8) + (**(char **)(this + 8) == '*');
  local_30 = 0;
  __ptr = (char *)__cxa_demangle(__s,0,0,&local_30);
  if (local_30 == 0) {
    __s = __ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_29);
  free(__ptr);
  name_str.field_2._8_8_ = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&name_str.field_2 + 8),local_70,
             name_str._M_dataplus._M_p + (long)local_70);
  CanonicalizeForStdLibVersioning(__return_storage_ptr__,(string *)((long)&name_str.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_str.field_2._8_8_ != &local_40) {
    operator_delete((void *)name_str.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  if ((size_type *)local_70 != &name_str._M_string_length) {
    operator_delete(local_70,name_str._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetTypeName(const std::type_info& type) {
  const char* const name = type.name();
#if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, nullptr, nullptr, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return CanonicalizeForStdLibVersioning(name_str);
#elif defined(_MSC_VER)
  // Strip struct and class due to differences between
  // MSVC and other compilers. std::pair<int,bool> is printed as
  // "struct std::pair<int,bool>" when using MSVC vs "std::pair<int, bool>" with
  // other compilers.
  std::string s = name;
  // Only strip the leading "struct " and "class ", so uses rfind == 0 to
  // ensure that
  if (s.rfind("struct ", 0) == 0) {
    s = s.substr(strlen("struct "));
  } else if (s.rfind("class ", 0) == 0) {
    s = s.substr(strlen("class "));
  }
  return s;
#else
  return name;
#endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC
}